

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result spvc_compiler_compile(spvc_compiler compiler,char **source)

{
  spvc_context_s *psVar1;
  pointer pCVar2;
  ulong uVar3;
  char *pcVar4;
  exception *e;
  string local_98;
  undefined4 local_78;
  allocator local_71;
  string local_70;
  undefined1 local_40 [8];
  string result;
  char **source_local;
  spvc_compiler compiler_local;
  
  result.field_2._8_8_ = source;
  pCVar2 = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
           operator->(&compiler->compiler);
  (*pCVar2->_vptr_Compiler[2])(local_40);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = spvc_context_s::allocate_name(compiler->context,(string *)local_40);
    *(char **)result.field_2._8_8_ = pcVar4;
    if (*(long *)result.field_2._8_8_ == 0) {
      psVar1 = compiler->context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_98,"Out of memory.",(allocator *)((long)&e + 7))
      ;
      spvc_context_s::report_error(psVar1,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
      compiler_local._4_4_ = SPVC_ERROR_OUT_OF_MEMORY;
    }
    else {
      compiler_local._4_4_ = SPVC_SUCCESS;
    }
  }
  else {
    psVar1 = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"Unsupported SPIR-V.",&local_71);
    spvc_context_s::report_error(psVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    compiler_local._4_4_ = SPVC_ERROR_UNSUPPORTED_SPIRV;
  }
  local_78 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return compiler_local._4_4_;
}

Assistant:

spvc_result spvc_compiler_compile(spvc_compiler compiler, const char **source)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto result = compiler->compiler->compile();
		if (result.empty())
		{
			compiler->context->report_error("Unsupported SPIR-V.");
			return SPVC_ERROR_UNSUPPORTED_SPIRV;
		}

		*source = compiler->context->allocate_name(result);
		if (!*source)
		{
			compiler->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}
		return SPVC_SUCCESS;
	}